

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O3

bool __thiscall
ON_Leader::Create(ON_Leader *this,wchar_t *leader_text,ON_DimStyle *dimstyle,int point_count,
                 ON_3dPoint *points,ON_Plane *plane,bool bWrapped,double rect_width)

{
  AnnotationType annotation_type;
  bool bVar1;
  ON_DimStyle *dim_style;
  ON_TextContent *this_00;
  long lVar2;
  ON_Plane *pOVar3;
  byte bVar4;
  ON_TextContent *local_b8;
  ON_Plane local_b0;
  
  bVar4 = 0;
  if (1 < point_count) {
    ON_2dPoint::operator=(&this->m_text_point,&ON_3dPoint::UnsetPoint);
    dim_style = ON_DimStyle::DimStyleOrDefault(dimstyle);
    ON_Annotation::SetDimensionStyleId(&this->super_ON_Annotation,dim_style);
    pOVar3 = &local_b0;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pOVar3->origin).x = (plane->origin).x;
      plane = (ON_Plane *)((long)plane + (ulong)bVar4 * -0x10 + 8);
      pOVar3 = (ON_Plane *)((long)pOVar3 + (ulong)bVar4 * -0x10 + 8);
    }
    SetPlane(this,&local_b0);
    ON_Plane::~ON_Plane(&local_b0);
    SetPoints3d(this,point_count,points);
    if (leader_text != (wchar_t *)0x0) {
      this_00 = (ON_TextContent *)operator_new(0xd8);
      ON_TextContent::ON_TextContent(this_00);
      local_b8 = this_00;
      annotation_type = ON_Annotation::Type(&this->super_ON_Annotation);
      bVar1 = ON_TextContent::Create
                        (this_00,leader_text,annotation_type,dim_style,bWrapped,rect_width,0.0);
      if (bVar1) {
        ON_Annotation::SetText(&this->super_ON_Annotation,&local_b8);
      }
      else {
        (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this_00);
      }
    }
  }
  return 1 < point_count;
}

Assistant:

bool ON_Leader::Create(
  const wchar_t* leader_text,
  const ON_DimStyle* dimstyle,
  int point_count,
  const ON_3dPoint* points,
  const ON_Plane& plane,
  bool bWrapped,
  double rect_width
  )
{
  if (point_count < 2)
    return false;
  InvalidateTextPoint();
  
  dimstyle = &ON_DimStyle::DimStyleOrDefault(dimstyle);

  SetDimensionStyleId(*dimstyle);

  SetPlane(plane);
  SetPoints3d(point_count, points);

  ON_TextContent* text = nullptr;
  if (nullptr != leader_text)
  {
    text = new ON_TextContent;
    if (text->Create(leader_text, Type(), dimstyle, bWrapped, rect_width, 0.0))
      SetText(text);
    else
    {
      delete text;
      text = 0;
    }
  }

  return true;
}